

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_util.cpp
# Opt level: O0

bool BmsUtil::utf8_to_wchar(char *org,wchar_t *out,int maxlen)

{
  size_t sVar1;
  size_t sStack_50;
  int r;
  size_t len_out;
  size_t len_in;
  char *but_out_iconv;
  ICONVCHR *buf_iconv;
  iconv_t cd;
  wchar_t *pwStack_20;
  int maxlen_local;
  wchar_t *out_local;
  char *org_local;
  
  cd._4_4_ = maxlen;
  pwStack_20 = out;
  out_local = (wchar_t *)org;
  buf_iconv = (ICONVCHR *)iconv_open("UTF-16LE","UTF-8");
  if (buf_iconv == (ICONVCHR *)0xffffffffffffffff) {
    org_local._7_1_ = false;
  }
  else {
    *pwStack_20 = L'\0';
    but_out_iconv = (char *)out_local;
    len_in = (size_t)pwStack_20;
    len_out = strlen((char *)out_local);
    sStack_50 = (size_t)(cd._4_4_ << 1);
    sVar1 = iconv(buf_iconv,&but_out_iconv,&len_out,(char **)&len_in,&stack0xffffffffffffffb0);
    if ((int)sVar1 == -1) {
      org_local._7_1_ = false;
    }
    else {
      *(undefined1 *)(len_in + 1) = 0;
      *(undefined1 *)len_in = 0;
      org_local._7_1_ = true;
    }
  }
  return org_local._7_1_;
}

Assistant:

bool BmsUtil::utf8_to_wchar(const char *org, wchar_t *out, int maxlen)
{
	iconv_t cd = iconv_open("UTF-16LE", "UTF-8");
	if (cd == (void*)-1)
		return false;

	out[0] = 0;
	ICONVCHR *buf_iconv = (ICONVCHR*)org;
	char *but_out_iconv = (char*)out;
	size_t len_in = strlen(org);
	size_t len_out = maxlen * 2;

	int r = iconv(cd, &buf_iconv, &len_in, &but_out_iconv, &len_out);
	if ((int)r == -1)
		return false;
	*but_out_iconv = *(but_out_iconv + 1) = 0;

	return true;
}